

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeSetAdaptivityAdjustment(void *arkode_mem,int adjust)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  
  iVar1 = arkAccessHAdaptMem(arkode_mem,"ARKodeSetAdaptivityAdjustment",&ark_mem,&hadapt_mem);
  if (iVar1 == 0) {
    if (ark_mem->step_supports_adaptive == 0) {
      iVar1 = -0x30;
      arkProcessError(ark_mem,-0x30,0x6ae,"ARKodeSetAdaptivityAdjustment",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                      ,"time-stepping module does not support temporal adaptivity");
    }
    else {
      hadapt_mem->adjust = adjust;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKodeSetAdaptivityAdjustment(void* arkode_mem, int adjust)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* store requested adjustment */
  hadapt_mem->adjust = adjust;
  return (ARK_SUCCESS);
}